

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O0

Orphan<capnp::Data> * __thiscall
capnp::Orphanage::newOrphanCopy<capnp::Data::Reader>
          (Orphan<capnp::Data> *__return_storage_ptr__,Orphanage *this,Reader copyFrom)

{
  BuilderArena *src;
  OrphanBuilder local_48;
  Orphanage *local_28;
  Orphanage *this_local;
  Reader copyFrom_local;
  
  copyFrom_local.super_ArrayPtr<const_unsigned_char>.ptr =
       (uchar *)copyFrom.super_ArrayPtr<const_unsigned_char>.size_;
  this_local = (Orphanage *)copyFrom.super_ArrayPtr<const_unsigned_char>.ptr;
  src = this->arena;
  local_28 = this;
  copyFrom_local.super_ArrayPtr<const_unsigned_char>.size_ = (size_t)__return_storage_ptr__;
  GetInnerReader<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&this_local);
  _::OrphanBuilder::copy((EVP_PKEY_CTX *)&local_48,(EVP_PKEY_CTX *)src);
  Orphan<capnp::Data>::Orphan(__return_storage_ptr__,&local_48);
  _::OrphanBuilder::~OrphanBuilder(&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline Orphan<FromReader<Reader>> Orphanage::newOrphanCopy(Reader copyFrom) const {
  return Orphan<FromReader<Reader>>(_::OrphanBuilder::copy(
      arena, capTable, GetInnerReader<FromReader<Reader>>::apply(copyFrom)));
}